

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamDens.cpp
# Opt level: O2

void __thiscall
OpenMD::TetrahedralityParamDens::TetrahedralityParamDens
          (TetrahedralityParamDens *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          double rCut,int ndensbins)

{
  SelectionEvaluator *this_00;
  SelectionEvaluator *this_01;
  pointer piVar1;
  pointer piVar2;
  ulong __new_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string *local_60;
  string *local_58;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,ndensbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__TetrahedralityParamDens_002ee980;
  std::__cxx11::string::string((string *)&this->selectionScript1_,(string *)sele1);
  local_60 = &this->selectionScript2_;
  local_58 = &this->selectionScript1_;
  std::__cxx11::string::string((string *)local_60,(string *)sele2);
  SelectionManager::SelectionManager(&this->seleMan1_,info);
  SelectionManager::SelectionManager(&this->seleMan2_,info);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this_01 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  this->rCut_ = rCut;
  (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_80,this_00);
    SelectionManager::setSelectionSet(&this->seleMan1_,(SelectionSet *)&local_80);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_80);
  }
  SelectionEvaluator::loadScriptString(this_01,sele2);
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_80,this_01);
    SelectionManager::setSelectionSet(&this->seleMan2_,(SelectionSet *)&local_80);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_80);
  }
  this->MinQ_ = -3.0;
  this->MaxQ_ = 1.1;
  __new_size = (ulong)(this->super_StaticAnalyser).nBins_;
  this->deltaQ_ = 4.1 / (double)__new_size;
  this->count_ = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->sliceCount_,__new_size);
  piVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar2 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    *piVar2 = 0;
  }
  getPrefix(&local_50,filename);
  std::operator+(&local_80,&local_50,".Qdens");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

TetrahedralityParamDens::TetrahedralityParamDens(SimInfo* info,
                                                   const std::string& filename,
                                                   const std::string& sele1,
                                                   const std::string& sele2,
                                                   double rCut, int ndensbins) :
      StaticAnalyser(info, filename, ndensbins),
      selectionScript1_(sele1), selectionScript2_(sele2), seleMan1_(info),
      seleMan2_(info), evaluator1_(info), evaluator2_(info), rCut_(rCut) {
    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    // Q can take values of 0 to 1.
    MinQ_   = -3.0;
    MaxQ_   = 1.1;
    deltaQ_ = (MaxQ_ - MinQ_) / nBins_;

    // zeroing the number of molecules investigated counter
    count_ = 0;

    // fixed number of bins
    sliceCount_.resize(nBins_);
    std::fill(sliceCount_.begin(), sliceCount_.end(), 0);

    setOutputName(getPrefix(filename) + ".Qdens");
  }